

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void __thiscall DScroller::Serialize(DScroller *this,FArchive *arc)

{
  FArchive *pFVar1;
  FArchive *arc_local;
  DScroller *this_local;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = ::operator<<(arc,&this->m_Type);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_dx);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_dy);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Affectee);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Control);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_LastHeight);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_vdx);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_vdy);
  pFVar1 = FArchive::operator<<(pFVar1,&this->m_Accel);
  pFVar1 = ::operator<<(pFVar1,&this->m_Parts);
  pFVar1 = ::operator<<(pFVar1,this->m_Interpolations);
  pFVar1 = ::operator<<(pFVar1,this->m_Interpolations + 1);
  ::operator<<(pFVar1,this->m_Interpolations + 2);
  return;
}

Assistant:

void DScroller::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << m_Type
		<< m_dx << m_dy
		<< m_Affectee
		<< m_Control
		<< m_LastHeight
		<< m_vdx << m_vdy
		<< m_Accel
		<< m_Parts
		<< m_Interpolations[0]
		<< m_Interpolations[1]
		<< m_Interpolations[2];
}